

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O2

enable_if_t<HasSize<vector<ShapeSceneEntity>_>::value_&&_HasData<vector<ShapeSceneEntity>_>::value,_std::ostream_&>
 pbrt::detail::operator<<
           (ostream *os,vector<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_> *v)

{
  ostream *poVar1;
  pointer pSVar2;
  ulong uVar3;
  pointer this;
  string local_50;
  
  std::operator<<(os,"[ ");
  pSVar2 = (v->super__Vector_base<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_>).
           _M_impl.super__Vector_impl_data._M_start;
  this = pSVar2;
  for (uVar3 = 0;
      uVar3 < (ulong)(((long)(v->
                             super__Vector_base<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2) / 0x120);
      uVar3 = uVar3 + 1) {
    ShapeSceneEntity::ToString_abi_cxx11_(&local_50,this);
    std::operator<<(os,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    pSVar2 = (v->super__Vector_base<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (uVar3 < ((long)(v->
                       super__Vector_base<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2) / 0x120 - 1U) {
      std::operator<<(os,", ");
      pSVar2 = (v->
               super__Vector_base<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_>).
               _M_impl.super__Vector_impl_data._M_start;
    }
    this = this + 1;
  }
  poVar1 = std::operator<<(os," ]");
  return poVar1;
}

Assistant:

inline std::enable_if_t<HasSize<T>::value && HasData<T>::value, std::ostream &>
operator<<(std::ostream &os, const T &v) {
    os << "[ ";
    auto ptr = v.data();
    for (size_t i = 0; i < v.size(); ++i) {
        os << ptr[i];
        if (i < v.size() - 1)
            os << ", ";
    }
    return os << " ]";
}